

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O1

iter_type __thiscall
booster::locale::util::base_num_parse<char>::do_real_get<unsigned_short>
          (base_num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          unsigned_short *val)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  ios_info *this_00;
  uint64_t uVar3;
  streambuf_type *psVar4;
  int_type iVar5;
  iter_type __beg;
  iter_type in_00;
  iter_type iVar6;
  iter_type iVar7;
  iter_type iVar8;
  iter_type iVar9;
  iter_type __end;
  iter_type end_00;
  iter_type __end_00;
  iter_type end_01;
  locale local_1c0;
  stringstream ss;
  undefined8 auStack_1b0 [2];
  undefined4 auStack_1a0 [26];
  ios_base local_138 [264];
  
  this_00 = ios_info::get(ios);
  uVar3 = ios_info::display_flags(this_00);
  auVar2 = in._0_12_;
  auVar1 = end._0_12_;
  if (uVar3 != 2) {
    if (uVar3 != 0) {
      iVar6._12_4_ = 0;
      iVar6._M_sbuf = (streambuf_type *)auVar2._0_8_;
      iVar6._M_c = auVar2._8_4_;
      __end_00._12_4_ = 0;
      __end_00._M_sbuf = (streambuf_type *)auVar1._0_8_;
      __end_00._M_c = auVar1._8_4_;
      iVar6 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::
              _M_extract_int_abi_cxx11_<unsigned_short>
                        ((num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>> *)this
                         ,iVar6,__end_00,ios,err,val);
      iVar8._M_sbuf = iVar6._M_sbuf;
      iVar8._M_c = iVar6._M_c;
      iVar8._12_4_ = iVar6._12_4_;
      return iVar8;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::locale::classic();
    std::ios::imbue(&local_1c0);
    std::locale::~locale(&local_1c0);
    *(undefined4 *)((long)auStack_1a0 + *(long *)(_ss + -0x18)) = *(undefined4 *)(ios + 0x18);
    *(undefined8 *)((long)auStack_1b0 + *(long *)(_ss + -0x18)) = *(undefined8 *)(ios + 8);
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)auVar2._0_8_;
    __beg._M_c = auVar2._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)auVar1._0_8_;
    __end._M_c = auVar1._8_4_;
    iVar6 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::
            _M_extract_int_abi_cxx11_<unsigned_short>
                      ((num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>> *)this,
                       __beg,__end,(ios_base *)((stringstream *)&ss + *(long *)(_ss + -0x18)),err,
                       val);
    psVar4 = iVar6._M_sbuf;
    iVar5 = iVar6._M_c;
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    goto LAB_0019fa94;
  }
  _ss = (longdouble)0;
  uVar3 = ios_info::currency_flags(this_00);
  if (uVar3 == 0) {
LAB_0019f9df:
    in_00._12_4_ = 0;
    in_00._M_sbuf = (streambuf_type *)auVar2._0_8_;
    in_00._M_c = auVar2._8_4_;
    end_00._12_4_ = 0;
    end_00._M_sbuf = (streambuf_type *)auVar1._0_8_;
    end_00._M_c = auVar1._8_4_;
    iVar7 = parse_currency<false>(this,in_00,end_00,ios,err,(longdouble *)&ss);
    auVar2 = iVar7._0_12_;
  }
  else {
    uVar3 = ios_info::currency_flags(this_00);
    if (uVar3 == 0x40) goto LAB_0019f9df;
    iVar7._12_4_ = 0;
    iVar7._M_sbuf = (streambuf_type *)auVar2._0_8_;
    iVar7._M_c = auVar2._8_4_;
    end_01._12_4_ = 0;
    end_01._M_sbuf = (streambuf_type *)auVar1._0_8_;
    end_01._M_c = auVar1._8_4_;
    iVar7 = parse_currency<true>(this,iVar7,end_01,ios,err,(longdouble *)&ss);
    auVar2 = iVar7._0_12_;
  }
  psVar4 = auVar2._0_8_;
  iVar5 = auVar2._8_4_;
  if ((*err & _S_failbit) == _S_goodbit) {
    *val = (unsigned_short)(int)ROUND(_ss);
  }
LAB_0019fa94:
  iVar9._M_c = iVar5;
  iVar9._M_sbuf = psVar4;
  iVar9._12_4_ = 0;
  return iVar9;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        typedef std::num_get<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                std::stringstream ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                return super::do_get(in,end,ss,err,val);
            }
        case flags::currency:
            {
                long double ret_val = 0;
                if(info.currency_flags()==flags::currency_default || info.currency_flags() == flags::currency_national)
                    in = parse_currency<false>(in,end,ios,err,ret_val);
                else
                    in = parse_currency<true>(in,end,ios,err,ret_val);
                if(!(err & std::ios_base::failbit))
                    val = static_cast<ValueType>(ret_val);
                return in;
            }

        // date-time parsing is not supported
        // due to buggy standard
        case flags::date:
        case flags::time:
        case flags::datetime:
        case flags::strftime:

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_get(in,end,ios,err,val);
        }
    }